

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

FileOptions * __thiscall
google::protobuf::FileDescriptorProto::mutable_options(FileDescriptorProto *this)

{
  FileOptions *pFVar1;
  
  *(byte *)&this->field_0 = *(byte *)&this->field_0 | 8;
  pFVar1 = _internal_mutable_options(this);
  return pFVar1;
}

Assistant:

inline ::google::protobuf::FileOptions* PROTOBUF_NONNULL FileDescriptorProto::mutable_options()
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  _impl_._has_bits_[0] |= 0x00000008u;
  ::google::protobuf::FileOptions* _msg = _internal_mutable_options();
  // @@protoc_insertion_point(field_mutable:google.protobuf.FileDescriptorProto.options)
  return _msg;
}